

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void compact_upto_with_circular_reuse_test(void)

{
  int iVar1;
  uint64_t num_markers;
  fdb_snapshot_info_t *markers_out;
  char valuebuf [512];
  char keybuf [256];
  fdb_status s;
  fdb_doc *doc;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_kvs_handle *db [3];
  fdb_file_handle *dbfile;
  int n_repeat;
  int idx;
  int k;
  int r;
  int j;
  int i;
  int n_dbs;
  int n_batch;
  int batch;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  uint64_t *in_stack_00000b78;
  fdb_snapshot_info_t **in_stack_00000b80;
  fdb_file_handle *in_stack_00000b88;
  fdb_file_handle *in_stack_fffffffffffffa18;
  fdb_file_handle *in_stack_fffffffffffffa20;
  fdb_snapshot_info_t *in_stack_fffffffffffffa28;
  void *in_stack_fffffffffffffa30;
  fdb_doc **in_stack_fffffffffffffa38;
  size_t in_stack_fffffffffffffa50;
  char local_4b8 [120];
  fdb_kvs_config *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  fdb_kvs_handle **in_stack_fffffffffffffbd0;
  fdb_file_handle *in_stack_fffffffffffffbd8;
  fdb_config *in_stack_fffffffffffffc38;
  char *in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc49;
  char local_2b8 [260];
  fdb_status local_1b4;
  fdb_doc *local_1b0;
  undefined1 local_190 [8];
  undefined8 local_188;
  fdb_snapshot_info_t *local_c0;
  undefined8 local_98 [4];
  int local_74;
  uint local_70;
  uint local_6c;
  int local_68;
  uint local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_54 = 100;
  local_58 = 0x40;
  local_5c = 3;
  local_74 = 4;
  memleak_start();
  local_68 = system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  memcpy(local_190,&stack0xfffffffffffffa50,0xf8);
  local_188 = 0;
  local_c0 = (fdb_snapshot_info_t *)0xa;
  fdb_get_default_kvs_config();
  local_1b4 = fdb_open((fdb_file_handle **)
                       CONCAT71(in_stack_fffffffffffffc49,in_stack_fffffffffffffc48),
                       in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  if (local_1b4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd5b);
    compact_upto_with_circular_reuse_test::__test_pass = 0;
    if (local_1b4 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd5b,"void compact_upto_with_circular_reuse_test()");
    }
  }
  local_1b4 = fdb_kvs_open(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                           in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  if (local_1b4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd5e);
    compact_upto_with_circular_reuse_test::__test_pass = 0;
    if (local_1b4 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd5e,"void compact_upto_with_circular_reuse_test()");
    }
  }
  local_1b4 = fdb_kvs_open(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                           in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  if (local_1b4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd61);
    compact_upto_with_circular_reuse_test::__test_pass = 0;
    if (local_1b4 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd61,"void compact_upto_with_circular_reuse_test()");
    }
  }
  local_1b4 = fdb_kvs_open(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                           in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  if (local_1b4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd64);
    compact_upto_with_circular_reuse_test::__test_pass = 0;
    if (local_1b4 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd64,"void compact_upto_with_circular_reuse_test()");
    }
  }
  memset(local_4b8,0x78,0x100);
  for (local_6c = 0; (int)local_6c < local_74; local_6c = local_6c + 1) {
    for (local_68 = 0; local_68 < local_58; local_68 = local_68 + 1) {
      for (local_64 = 1; (int)local_64 < local_5c; local_64 = local_64 + 1) {
        for (local_60 = 0; local_60 < local_54; local_60 = local_60 + 1) {
          local_70 = local_68 * local_54 + local_60;
          sprintf(local_2b8,"k%06d",(ulong)local_70);
          sprintf(local_4b8,"v%d_%04d_%d",(ulong)local_64,(ulong)local_70,(ulong)local_6c);
          in_stack_fffffffffffffa18 = (fdb_file_handle *)0x101;
          local_1b4 = fdb_doc_create(in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                                     (size_t)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
                                     0x101,(void *)0x1175f6,in_stack_fffffffffffffa50);
          if (local_1b4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd70);
            compact_upto_with_circular_reuse_test::__test_pass = 0;
            if (local_1b4 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                            ,0xd70,"void compact_upto_with_circular_reuse_test()");
            }
          }
          local_1b4 = fdb_set((fdb_kvs_handle *)local_98[(int)local_64],local_1b0);
          if (local_1b4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd72);
            compact_upto_with_circular_reuse_test::__test_pass = 0;
            if (local_1b4 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                            ,0xd72,"void compact_upto_with_circular_reuse_test()");
            }
          }
          local_1b4 = fdb_doc_free((fdb_doc *)0x1176f8);
          if (local_1b4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd74);
            compact_upto_with_circular_reuse_test::__test_pass = 0;
            if (local_1b4 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                            ,0xd74,"void compact_upto_with_circular_reuse_test()");
            }
          }
        }
      }
      local_1b4 = fdb_commit(in_stack_fffffffffffffa18,'\0');
      if (local_1b4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xd78);
        compact_upto_with_circular_reuse_test::__test_pass = 0;
        if (local_1b4 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xd78,"void compact_upto_with_circular_reuse_test()");
        }
      }
    }
  }
  local_1b4 = fdb_get_all_snap_markers(in_stack_00000b88,in_stack_00000b80,in_stack_00000b78);
  if (local_1b4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd80);
    compact_upto_with_circular_reuse_test::__test_pass = 0;
    if (local_1b4 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd80,"void compact_upto_with_circular_reuse_test()");
    }
  }
  if (local_c0 < in_stack_fffffffffffffa28) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd83);
    compact_upto_with_circular_reuse_test::__test_pass = 0;
    if (local_c0 < in_stack_fffffffffffffa28) {
      __assert_fail("num_markers <= config.num_keeping_headers",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd83,"void compact_upto_with_circular_reuse_test()");
    }
  }
  local_1b4 = fdb_compact_upto(in_stack_fffffffffffffa20,(char *)in_stack_fffffffffffffa18,0x11794e)
  ;
  if (local_1b4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd86);
    compact_upto_with_circular_reuse_test::__test_pass = 0;
    if (local_1b4 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd86,"void compact_upto_with_circular_reuse_test()");
    }
  }
  local_1b4 = fdb_free_snap_markers(in_stack_fffffffffffffa28,(uint64_t)in_stack_fffffffffffffa20);
  if (local_1b4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd89);
    compact_upto_with_circular_reuse_test::__test_pass = 0;
    if (local_1b4 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd89,"void compact_upto_with_circular_reuse_test()");
    }
  }
  local_6c = local_74 - 1;
  local_68 = 0;
  do {
    if (local_58 <= local_68) {
      local_1b4 = fdb_close(in_stack_fffffffffffffa18);
      if (local_1b4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xda1);
        compact_upto_with_circular_reuse_test::__test_pass = 0;
        if (local_1b4 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xda1,"void compact_upto_with_circular_reuse_test()");
        }
      }
      local_1b4 = fdb_shutdown();
      if (local_1b4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xda4);
        compact_upto_with_circular_reuse_test::__test_pass = 0;
        if (local_1b4 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xda4,"void compact_upto_with_circular_reuse_test()");
        }
      }
      memleak_end();
      if (compact_upto_with_circular_reuse_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","compact upto with circular reuse test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","compact upto with circular reuse test");
      }
      return;
    }
    for (local_64 = 1; (int)local_64 < local_5c; local_64 = local_64 + 1) {
      for (local_60 = 0; local_60 < local_54; local_60 = local_60 + 1) {
        local_70 = local_68 * local_54 + local_60;
        sprintf(local_2b8,"k%06d",(ulong)local_70);
        sprintf(local_4b8,"v%d_%04d_%d",(ulong)local_64,(ulong)local_70,(ulong)local_6c);
        in_stack_fffffffffffffa18 = (fdb_file_handle *)0x0;
        local_1b4 = fdb_doc_create(in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                                   (size_t)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,0,
                                   (void *)0x117b36,in_stack_fffffffffffffa50);
        if (local_1b4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xd94);
          compact_upto_with_circular_reuse_test::__test_pass = 0;
          if (local_1b4 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0xd94,"void compact_upto_with_circular_reuse_test()");
          }
        }
        local_1b4 = fdb_get((fdb_kvs_handle *)local_98[(int)local_64],local_1b0);
        if (local_1b4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xd96);
          compact_upto_with_circular_reuse_test::__test_pass = 0;
          if (local_1b4 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0xd96,"void compact_upto_with_circular_reuse_test()");
          }
        }
        iVar1 = memcmp(local_1b0->body,local_4b8,local_1b0->bodylen);
        if (iVar1 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_4b8,local_1b0->body,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xd97);
          compact_upto_with_circular_reuse_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xd97,"void compact_upto_with_circular_reuse_test()");
        }
        local_1b4 = fdb_doc_free((fdb_doc *)0x117cc4);
        if (local_1b4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xd99);
          compact_upto_with_circular_reuse_test::__test_pass = 0;
          if (local_1b4 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0xd99,"void compact_upto_with_circular_reuse_test()");
          }
        }
      }
    }
    local_1b4 = fdb_commit(in_stack_fffffffffffffa18,'\0');
    if (local_1b4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xd9d);
      compact_upto_with_circular_reuse_test::__test_pass = 0;
      if (local_1b4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xd9d,"void compact_upto_with_circular_reuse_test()");
      }
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

void compact_upto_with_circular_reuse_test()
{
    TEST_INIT();
    int batch=100, n_batch=64, n_dbs=3, i, j, r, k, idx;
    int n_repeat = 4;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db[3];
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc;
    fdb_status s; (void)s;
    char keybuf[256], valuebuf[512];

    memleak_start();

    // remove previous dummy files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    config.num_keeping_headers = 10;
    kvs_config = fdb_get_default_kvs_config();

    // create a file
    s = fdb_open(&dbfile, "compact_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db[0], NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db[1], "db1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db[2], "db2", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memset(valuebuf, 'x', 256);
    valuebuf[256] = 0;
    for (k=0; k<n_repeat; ++k) {
        for (r=0; r<n_batch; ++r) {
            for (j=1; j<n_dbs; ++j) {
                for (i=0; i<batch; ++i) {
                    idx = r*batch + i;
                    sprintf(keybuf, "k%06d", idx);
                    sprintf(valuebuf, "v%d_%04d_%d", j, idx, k);
                    s = fdb_doc_create(&doc, keybuf, 8, NULL, 0, valuebuf, 257);
                    TEST_CHK(s == FDB_RESULT_SUCCESS);
                    s = fdb_set(db[j], doc);
                    TEST_CHK(s == FDB_RESULT_SUCCESS);
                    s = fdb_doc_free(doc);
                    TEST_CHK(s == FDB_RESULT_SUCCESS);
                }
            }
            s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
        }
    }

    fdb_snapshot_info_t *markers_out;
    uint64_t num_markers;

    s = fdb_get_all_snap_markers(dbfile, &markers_out, &num_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // num_markers should be equal to or smaller than num_keeping_headers
    TEST_CHK(num_markers <= config.num_keeping_headers);

    s = fdb_compact_upto(dbfile, "compact_test_compact", markers_out[5].marker);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_free_snap_markers(markers_out, num_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // all docs should be retrieved correclty.
    k = n_repeat - 1;
    for (r=0; r<n_batch; ++r) {
        for (j=1; j<n_dbs; ++j) {
            for (i=0; i<batch; ++i) {
                idx = r*batch + i;
                sprintf(keybuf, "k%06d", idx);
                sprintf(valuebuf, "v%d_%04d_%d", j, idx, k);
                s = fdb_doc_create(&doc, keybuf, 8, NULL, 0, NULL, 0);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                s = fdb_get(db[j], doc);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                TEST_CMP(doc->body, valuebuf, doc->bodylen);
                s = fdb_doc_free(doc);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
        }
        s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memleak_end();

    TEST_RESULT("compact upto with circular reuse test");
}